

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O3

int comma2semicolon(char *string)

{
  byte bVar1;
  int iVar2;
  byte *local_10;
  
LAB_0012d8fd:
  while( true ) {
    bVar1 = *string;
    if (bVar1 < 0x2c) break;
    if (bVar1 == 0x7b) {
      local_10 = (byte *)string + 1;
      iVar2 = find_curlybracket((char **)&local_10);
    }
    else {
      if (bVar1 != 0x5b) {
        if (bVar1 == 0x2c) {
          *string = 0x3b;
        }
        goto LAB_0012d93b;
      }
      local_10 = (byte *)string + 1;
      iVar2 = find_bracket((char **)&local_10);
    }
LAB_0012d9aa:
    string = (char *)local_10;
    if (iVar2 != 0) {
      return 1;
    }
  }
  if (bVar1 < 0x27) {
    if (bVar1 == 0x22) {
      string = (char *)((byte *)string + 2);
      while( true ) {
        if (((byte *)string)[-1] == 0) {
          return 1;
        }
        if (((byte *)string)[-1] == 0x22) break;
        string = (char *)((byte *)string + 1);
      }
      goto LAB_0012d8fd;
    }
    if (bVar1 == 0) {
      return (uint)bVar1;
    }
  }
  else {
    if (bVar1 == 0x27) {
      string = (char *)((byte *)string + 2);
      while( true ) {
        if (((byte *)string)[-1] == 0) {
          return 1;
        }
        if (((byte *)string)[-1] == 0x27) break;
        string = (char *)((byte *)string + 1);
      }
      goto LAB_0012d8fd;
    }
    if (bVar1 == 0x28) {
      local_10 = (byte *)string + 1;
      iVar2 = find_paren((char **)&local_10);
      goto LAB_0012d9aa;
    }
  }
LAB_0012d93b:
  string = (char *)((byte *)string + 1);
  goto LAB_0012d8fd;
}

Assistant:

int comma2semicolon(char *string)

/*  
    replace commas with semicolons, unless the comma is within a quoted or bracketed expression 
*/
{
    char *tstr;

    tstr = string;

    while (*tstr) {

        if (*tstr == ',') { /* found a comma */
           *tstr = ';';
           tstr++;
        } else if (*tstr == '(') { /* found another level of parens */
           tstr++;
           if (find_paren(&tstr)) return(1); 
        } else if (*tstr == '[') { 
           tstr++;
           if (find_bracket(&tstr)) return(1);
        } else if (*tstr == '{') { 
           tstr++;
           if (find_curlybracket(&tstr)) return(1);
        } else if (*tstr == '"') { 
           tstr++;
           if (find_doublequote(&tstr)) return(1);
        } else if (*tstr == '\'') { 
           tstr++;
           if (find_quote(&tstr)) return(1);
        } else { 
           tstr++;
        }
    }
    return(0);  /* reached end of string */
}